

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall Json::StyledWriter::writeValue(StyledWriter *this,Value *value)

{
  String *pSVar1;
  pointer pbVar2;
  char cVar3;
  bool bVar4;
  Value *root;
  size_t sVar5;
  int iVar6;
  LargestUInt value_00;
  LargestInt value_01;
  char *pcVar7;
  PrecisionType in_R8D;
  pointer key;
  Json *pJVar8;
  double value_02;
  Members members;
  String local_68;
  Members local_48;
  
  cVar3 = (char)*(ushort *)&value->bits_;
  iVar6 = 0x13c3d4;
  switch(cVar3) {
  case '\0':
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"null","");
    pushValue(this,&local_68);
    goto LAB_00113cc1;
  case '\x01':
    pJVar8 = (Json *)Value::asInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar8,value_01);
    pushValue(this,&local_68);
    break;
  case '\x02':
    pJVar8 = (Json *)Value::asUInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar8,value_00);
    pushValue(this,&local_68);
    break;
  case '\x03':
    value_02 = Value::asDouble(value);
    (anonymous_namespace)::valueToString_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)0x0,value_02,true,0,in_R8D);
    pushValue(this,&local_68);
    break;
  case '\x04':
    pJVar8 = (Json *)(value->value_).string_;
    bVar4 = pJVar8 != (Json *)0x0;
    if (bVar4 && cVar3 == '\x04') {
      if ((*(ushort *)&value->bits_ >> 8 & 1) == 0) {
        sVar5 = strlen((char *)pJVar8);
        iVar6 = (int)sVar5;
      }
      else {
        iVar6 = *(int *)pJVar8;
        pJVar8 = pJVar8 + 4;
      }
      iVar6 = iVar6 + (int)pJVar8;
    }
    if (bVar4 && cVar3 == '\x04') {
      valueToQuotedStringN_abi_cxx11_
                (&local_68,pJVar8,(char *)(ulong)(uint)(iVar6 - (int)pJVar8),0,SUB41(in_R8D,0));
      pushValue(this,&local_68);
      break;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    pushValue(this,&local_68);
LAB_00113cc1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_00113c7f;
  case '\x05':
    bVar4 = Value::asBool(value);
    pcVar7 = "false";
    if (bVar4) {
      pcVar7 = "true";
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar7,pcVar7 + ((ulong)bVar4 ^ 5));
    pushValue(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_00113c7f;
  case '\x06':
    writeArrayValue(this,value);
    return;
  case '\a':
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"{}","");
      pushValue(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) goto LAB_00113b52;
    }
    else {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"{","");
      writeIndent(this);
      pSVar1 = &this->document_;
      std::__cxx11::string::_M_append((char *)pSVar1,(ulong)local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      indent(this);
      key = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        root = Value::operator[](value,key);
        writeCommentBeforeValue(this,root);
        pJVar8 = (Json *)(key->_M_dataplus)._M_p;
        sVar5 = strlen((char *)pJVar8);
        valueToQuotedStringN_abi_cxx11_
                  (&local_68,pJVar8,(char *)(sVar5 & 0xffffffff),0,SUB41(in_R8D,0));
        writeIndent(this);
        std::__cxx11::string::_M_append((char *)pSVar1,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)pSVar1);
        writeValue(this,root);
        pbVar2 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        key = key + 1;
        if (key != local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::push_back((char)pSVar1);
        }
        writeCommentAfterValueOnSameLine(this,root);
      } while (key != pbVar2);
      unindent(this);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"}","");
      writeIndent(this);
      std::__cxx11::string::_M_append((char *)pSVar1,(ulong)local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_00113b52:
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  default:
    goto switchD_0011391d_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_00113c7f:
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
switchD_0011391d_default:
  return;
}

Assistant:

void StyledWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    pushValue("null");
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble()));
    break;
  case stringValue: {
    // Is NULL possible for value.string_? No.
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok)
      pushValue(valueToQuotedStringN(str, static_cast<unsigned>(end - str)));
    else
      pushValue("");
    break;
  }
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      auto it = members.begin();
      for (;;) {
        const String& name = *it;
        const Value& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedString(name.c_str()));
        document_ += " : ";
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}